

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Player.cpp
# Opt level: O1

void __thiscall
helics::apps::Player::Player
          (Player *this,string_view appName,shared_ptr<helics::Core> *core,FederateInfo *fedInfo)

{
  _Rb_tree_header *p_Var1;
  element_type *peVar2;
  
  apps::App::App(&this->super_App,appName,core,fedInfo);
  (this->super_App)._vptr_App = (_func_int **)&PTR__Player_00559260;
  (this->points).
  super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->points).
  super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->points).
  super__Vector_base<helics::apps::ValueSetter,_std::allocator<helics::apps::ValueSetter>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->messages).
  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->messages).
  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->messages).
  super__Vector_base<helics::apps::MessageHolder,_std::allocator<helics::apps::MessageHolder>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->tags)._M_h._M_buckets = &(this->tags)._M_h._M_single_bucket;
  (this->tags)._M_h._M_bucket_count = 1;
  (this->tags)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->tags)._M_h._M_element_count = 0;
  (this->tags)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->tags)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->tags)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  p_Var1 = &(this->epts)._M_t._M_impl.super__Rb_tree_header;
  (this->epts)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->epts)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->epts)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->epts)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->epts)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_map_size = 0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->publications).super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>.
  _M_impl.super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  CLI::std::_Deque_base<helics::Publication,_std::allocator<helics::Publication>_>::
  _M_initialize_map(&(this->publications).
                     super__Deque_base<helics::Publication,_std::allocator<helics::Publication>_>,0)
  ;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_last = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_node = (_Map_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_cur = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_finish._M_first = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_last = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_node = (_Map_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_cur = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_start._M_first = (_Elt_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_map = (_Map_pointer)0x0;
  (this->endpoints).super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>._M_impl.
  super__Deque_impl_data._M_map_size = 0;
  CLI::std::_Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>::_M_initialize_map
            (&(this->endpoints).
              super__Deque_base<helics::Endpoint,_std::allocator<helics::Endpoint>_>,0);
  (this->pubids)._M_h._M_buckets = &(this->pubids)._M_h._M_single_bucket;
  (this->pubids)._M_h._M_bucket_count = 1;
  (this->pubids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->pubids)._M_h._M_element_count = 0;
  (this->pubids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->pubids)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->pubids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->eptids)._M_h._M_buckets = &(this->eptids)._M_h._M_single_bucket;
  (this->eptids)._M_h._M_bucket_count = 1;
  (this->eptids)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->eptids)._M_h._M_element_count = 0;
  (this->eptids)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->eptids)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->eptids)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  this->defType = HELICS_STRING;
  this->pointIndex = 0;
  this->messageIndex = 0;
  this->units = sec;
  this->timeMultiplier = 1.0;
  (this->nextPrintTimeStep).internalTimeCode = 0;
  if ((this->super_App).deactivated == false) {
    peVar2 = (this->super_App).fed.
             super___shared_ptr<helics::CombinationFederate,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (*(peVar2->super_ValueFederate)._vptr_ValueFederate[2])(peVar2,4,1);
    apps::App::loadInputFiles(&this->super_App);
  }
  return;
}

Assistant:

Player::Player(std::string_view appName,
               const std::shared_ptr<Core>& core,
               const FederateInfo& fedInfo): App(appName, core, fedInfo)
{
    initialSetup();
}